

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

void __thiscall AActor::Die(AActor *this,AActor *source,AActor *inflictor,int dmgflags)

{
  byte *pbVar1;
  DBot **obj;
  BYTE BVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  AInventory *pAVar7;
  AInventory *pAVar8;
  FState *pFVar9;
  PClass *pPVar10;
  DBot *pDVar11;
  AActor *pAVar12;
  DBot *pDVar13;
  AActor *pAVar14;
  char *pcVar15;
  char *pcVar16;
  DHUDMessageFadeOut *pDVar17;
  uint uVar18;
  player_t *ppVar19;
  player_t *ppVar20;
  byte bVar21;
  long lVar22;
  DBaseStatusBar *pDVar23;
  char *pcVar24;
  int realstyle;
  AActor *realthis;
  FName local_158;
  FName local_154;
  FName local_150;
  FName local_14c;
  FName local_148;
  FName local_144;
  FName local_140;
  int realhealth;
  char buff [256];
  
  iVar5 = this->health;
  iVar4 = GetGibHealth(this);
  realthis = (AActor *)0x0;
  realstyle = 0;
  realhealth = 0;
  bVar3 = P_MorphedDeath(this,&realthis,&realstyle,&realhealth);
  if (bVar3) {
    if ((realstyle & 0x800U) != 0) {
      return;
    }
    if ((iVar5 < iVar4) && (iVar5 = GetGibHealth(realthis), iVar5 <= realthis->health)) {
      realthis->health = iVar5 + -1;
    }
    CallDie(realthis,source,inflictor,dmgflags);
    return;
  }
  *(byte *)&this->effects = (byte)this->effects & 0xdf;
  if ((debugfile != (FILE *)0x0) && (this->player != (player_t *)0x0)) {
    fprintf((FILE *)debugfile,"died (%d) on tic %d (%s)\n",
            (long)&this->player[-0x916e].morphTics / 0x2a0 & 0xffffffff,(ulong)(uint)gametic);
  }
  pAVar7 = GC::ReadBarrier<AInventory>((AInventory **)&this->Inventory);
  while (pAVar7 != (AInventory *)0x0) {
    pAVar8 = GC::ReadBarrier<AInventory>((AInventory **)&(pAVar7->super_AActor).Inventory);
    (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x30])(pAVar7);
    pAVar7 = pAVar8;
  }
  uVar6 = (this->flags).Value;
  if ((uVar6 >> 0x10 & 1) != 0) {
    P_ExplodeMissile(this,(line_t_conflict *)0x0,(AActor *)0x0);
    return;
  }
  if (source != (AActor *)0x0) {
    (this->target).field_0.p = source;
  }
  if (((this->player == (player_t *)0x0) &&
      (uVar18 = (this->flags7).Value, (uVar18 >> 0x18 & 1) == 0)) &&
     (((uVar18 >> 0x17 & 1) != 0 || ((gameinfo.forcekillscripts & 1U) != 0)))) {
    FBehavior::StaticStartTypedScripts(0x11,this,true,0,true);
    uVar6 = (this->flags).Value;
  }
  uVar18 = uVar6 & 0xfeffbffb;
  (this->flags).Value = uVar18;
  if (((this->flags4).Value & 0x2000) == 0) {
    uVar18 = uVar6 & 0xfeffbdfb;
    (this->flags).Value = uVar18;
  }
  (this->flags).Value = uVar18 | 0x400;
  if (((this->flags3).Value & 0x2000) == 0) {
    local_140.Index = 0x8d;
    pFVar9 = FindState(this,&local_140);
    if ((pFVar9 != (FState *)0x0) ||
       (bVar3 = DObject::IsKindOf((DObject *)this,APlayerPawn::RegistrationInfo.MyClass), bVar3))
    goto LAB_00407300;
    uVar6 = (this->flags6).Value;
  }
  else {
LAB_00407300:
    uVar6 = (this->flags6).Value;
    if ((uVar6 >> 0x19 & 1) == 0) {
      pbVar1 = (byte *)((long)&(this->flags).Value + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
  }
  (this->flags6).Value = uVar6 | 0x40000;
  if ((this->DamageType).super_FName.Index == 0xa4) {
    pPVar10 = DObject::GetClass((DObject *)this);
    pcVar24 = *(char **)&pPVar10[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.loadOp;
    if ((double)pcVar24 < 0.0) goto LAB_00407344;
  }
  else {
LAB_00407344:
    pPVar10 = DObject::GetClass((DObject *)this);
    pcVar24 = pPVar10[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.mDescriptiveName.Chars;
  }
  if (0.0 <= (double)pcVar24) {
    if ((double)pcVar24 <= 0.0) {
      pcVar24 = (char *)0x0;
    }
  }
  else {
    pcVar24 = (char *)(this->Height * 0.25);
  }
  this->Height = (double)pcVar24;
  uVar6 = (this->flags).Value;
  if ((this->special != 0) &&
     ((((uVar6 & 1) == 0 || (((this->flags3).Value & 0x2000) != 0)) &&
      ((this->activationtype & 0x40) == 0)))) {
    P_ActivateThingSpecial(this,source,true);
    uVar6 = (this->flags).Value;
  }
  uVar6 = uVar6 & 0x8400000;
  if (uVar6 == 0x400000) {
    level.killed_monsters = level.killed_monsters + 1;
  }
  if ((source == (AActor *)0x0) || (ppVar20 = source->player, ppVar20 == (player_t *)0x0)) {
    if ((uVar6 == 0x400000) && (multiplayer == false)) {
      DAT_017dc078._0_4_ = (int)DAT_017dc078 + 1;
    }
LAB_004074ce:
    ppVar19 = this->player;
  }
  else {
    if (uVar6 == 0x400000) {
      ppVar20->killcount = ppVar20->killcount + 1;
    }
    ppVar19 = this->player;
    if ((ppVar19 != (player_t *)0x0) && (level.maptime != 0)) {
      ppVar20->frags[(long)&ppVar19[-0x916e].morphTics / 0x2a0] =
           ppVar20->frags[(long)&ppVar19[-0x916e].morphTics / 0x2a0] + 1;
      if (ppVar19 == ppVar20) {
        ppVar19->fragcount = ppVar19->fragcount + -1;
        if (((deathmatch.Value == 0) || (ppVar19->spreecount < 5)) || (cl_showsprees.Value != true))
        goto LAB_00407c37;
        pcVar24 = FStringTable::operator()(&GStrings,"SPREEKILLSELF");
        iVar5 = userinfo_t::GetGender(&this->player->userinfo);
        pcVar15 = userinfo_t::GetName(&this->player->userinfo);
        pcVar16 = userinfo_t::GetName(&this->player->userinfo);
        SexMessage(pcVar24,buff,iVar5,pcVar15,pcVar16);
        pDVar23 = StatusBar;
        pDVar17 = (DHUDMessageFadeOut *)DObject::operator_new(200);
        DHUDMessageFadeOut::DHUDMessageFadeOut(pDVar17,SmallFont,buff,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
LAB_00407c21:
        DBaseStatusBar::AttachMessage(pDVar23,&pDVar17->super_DHUDMessage,0x5250534b,0);
      }
      else {
        if (((dmflags2.Value._1_1_ & 0x80) != 0) && (deathmatch.Value != 0)) {
          ppVar19->fragcount = ppVar19->fragcount + -1;
        }
        bVar3 = IsTeammate(this,source);
        ppVar20 = source->player;
        if (bVar3) {
          ppVar20->fragcount = ppVar20->fragcount + -1;
        }
        else {
          ppVar20->fragcount = ppVar20->fragcount + 1;
          ppVar20->spreecount = ppVar20->spreecount + '\x01';
        }
        if (ppVar20->morphTics != 0) {
          GiveInventoryType(source,(PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
        }
        if ((deathmatch.Value != 0) && (cl_showsprees.Value == true)) {
          BVar2 = source->player->spreecount;
          if (BVar2 == '\x05') {
            pcVar24 = "SPREE5";
LAB_00407a65:
            pcVar24 = FStringTable::operator()(&GStrings,pcVar24);
            if (pcVar24 != (char *)0x0) {
              bVar3 = AnnounceSpree(source);
              if (!bVar3) {
                iVar5 = userinfo_t::GetGender(&this->player->userinfo);
                pcVar15 = userinfo_t::GetName(&this->player->userinfo);
                pcVar16 = userinfo_t::GetName(&source->player->userinfo);
                SexMessage(pcVar24,buff,iVar5,pcVar15,pcVar16);
                pDVar23 = StatusBar;
                pDVar17 = (DHUDMessageFadeOut *)DObject::operator_new(200);
                DHUDMessageFadeOut::DHUDMessageFadeOut
                          (pDVar17,SmallFont,buff,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
                goto LAB_00407c21;
              }
              goto LAB_00407c37;
            }
          }
          else {
            if (BVar2 == '\x19') {
              pcVar24 = "SPREE25";
              goto LAB_00407a65;
            }
            if (BVar2 == '\x0f') {
              pcVar24 = "SPREE15";
              goto LAB_00407a65;
            }
            if (BVar2 == '\x14') {
              pcVar24 = "SPREE20";
              goto LAB_00407a65;
            }
            if (BVar2 == '\n') {
              pcVar24 = "SPREE10";
              goto LAB_00407a65;
            }
          }
          if ((4 < this->player->spreecount) && (bVar3 = AnnounceSpreeLoss(this), !bVar3)) {
            pcVar24 = FStringTable::operator()(&GStrings,"SPREEOVER");
            iVar5 = userinfo_t::GetGender(&this->player->userinfo);
            pcVar15 = userinfo_t::GetName(&this->player->userinfo);
            pcVar16 = userinfo_t::GetName(&source->player->userinfo);
            SexMessage(pcVar24,buff,iVar5,pcVar15,pcVar16);
            pDVar23 = StatusBar;
            pDVar17 = (DHUDMessageFadeOut *)DObject::operator_new(200);
            DHUDMessageFadeOut::DHUDMessageFadeOut
                      (pDVar17,SmallFont,buff,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
            goto LAB_00407c21;
          }
        }
      }
LAB_00407c37:
      ppVar20 = source->player;
      if (this->player != ppVar20) {
        ppVar20->multicount = ppVar20->multicount + '\x01';
        if (0 < ppVar20->lastkilltime) {
          if (ppVar20->lastkilltime < level.time + -0x69) {
            ppVar20->multicount = '\x01';
          }
          if (((deathmatch.Value != 0) && (bVar3 = CheckLocalView(source,consoleplayer), bVar3)) &&
             (cl_showmultikills.Value == true)) {
            switch(source->player->multicount) {
            case '\x01':
              goto switchD_00407cd1_caseD_1;
            case '\x02':
              pcVar24 = "MULTI2";
              break;
            case '\x03':
              pcVar24 = "MULTI3";
              break;
            case '\x04':
              pcVar24 = "MULTI4";
              break;
            default:
              pcVar24 = "MULTI5";
            }
            pcVar24 = FStringTable::operator()(&GStrings,pcVar24);
            if ((pcVar24 != (char *)0x0) && (bVar3 = AnnounceMultikill(source), !bVar3)) {
              iVar5 = userinfo_t::GetGender(&this->player->userinfo);
              pcVar15 = userinfo_t::GetName(&this->player->userinfo);
              pcVar16 = userinfo_t::GetName(&source->player->userinfo);
              SexMessage(pcVar24,buff,iVar5,pcVar15,pcVar16);
              pDVar23 = StatusBar;
              pDVar17 = (DHUDMessageFadeOut *)DObject::operator_new(200);
              DHUDMessageFadeOut::DHUDMessageFadeOut
                        (pDVar17,SmallFont,buff,1.5,0.8,0,0,CR_RED,3.0,0.5);
              DBaseStatusBar::AttachMessage(pDVar23,(DHUDMessage *)pDVar17,0x4c494b4d,0);
            }
          }
        }
switchD_00407cd1_caseD_1:
        ppVar20 = source->player;
        ppVar20->lastkilltime = level.time;
      }
      iVar5 = fraglimit.Value;
      if (((deathmatch.Value != 0) && (fraglimit.Value != 0)) &&
         (iVar4 = D_GetFragCount(ppVar20), iVar5 <= iVar4)) {
        FStringTable::operator()(&GStrings,"TXT_FRAGLIMIT");
        Printf("%s\n");
        G_ExitLevel(0,false);
      }
      goto LAB_004074ce;
    }
  }
  if (ppVar19 != (player_t *)0x0) {
    ClientObituary(this,inflictor,source,dmgflags);
    FBehavior::StaticStartTypedScripts(3,this,true,0,false);
    ppVar20 = this->player;
    ppVar20->respawn_time = level.time + 0x23;
    if ((bglobal.botnum != 0) && (demoplayback == false)) {
      pDVar11 = GC::ReadBarrier<DBot>((DBot **)&ppVar20->Bot);
      if (pDVar11 != (DBot *)0x0) {
        iVar4 = FRandom::operator()(&pr_botrespawn);
        iVar5 = bglobal.botnum * 2;
        pDVar11 = GC::ReadBarrier<DBot>((DBot **)&this->player->Bot);
        pDVar11->t_respawn = iVar4 % 0xf + iVar5 + 0x22;
      }
      for (lVar22 = 0x198; lVar22 != 0x1698; lVar22 = lVar22 + 0x2a0) {
        obj = (DBot **)((long)&players + lVar22);
        pDVar11 = GC::ReadBarrier<DBot>(obj);
        if (pDVar11 != (DBot *)0x0) {
          pDVar11 = GC::ReadBarrier<DBot>(obj);
          pAVar12 = GC::ReadBarrier<AActor>((AActor **)&pDVar11->enemy);
          if (pAVar12 == this) {
            pDVar11 = GC::ReadBarrier<DBot>(obj);
            pDVar13 = GC::ReadBarrier<DBot>(obj);
            pAVar12 = GC::ReadBarrier<AActor>((AActor **)&pDVar13->enemy);
            pAVar14 = GC::ReadBarrier<AActor>((AActor **)&pDVar11->dest);
            if (pAVar14 == pAVar12) {
              pDVar11 = GC::ReadBarrier<DBot>(obj);
              (pDVar11->dest).field_0.p = (AActor *)0x0;
            }
            pDVar11 = GC::ReadBarrier<DBot>(obj);
            (pDVar11->enemy).field_0.p = (AActor *)0x0;
          }
        }
      }
      ppVar20 = this->player;
      ppVar20->multicount = '\0';
      ppVar20->spreecount = '\0';
    }
    if (source == (AActor *)0x0) {
      ppVar20->frags[(long)&ppVar20[-0x916e].morphTics / 0x2a0] =
           ppVar20->frags[(long)&ppVar20[-0x916e].morphTics / 0x2a0] + 1;
      ppVar20->fragcount = ppVar20->fragcount + -1;
    }
    *(byte *)&(this->flags).Value = (byte)(this->flags).Value & 0xfd;
    ppVar20->playerstate = '\x01';
    P_DropWeapon(ppVar20);
    pAVar12 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    if ((pAVar12 == this) && (automapactive == true)) {
      AM_Stop();
    }
    this->player->extralight = 0;
  }
  if (((this->flags).Value & 0x10000000) == 0) {
    iVar5 = GetGibHealth(this);
    if (inflictor == (AActor *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (inflictor->flags4).Value;
    }
    bVar21 = (uVar6 >> 0x1c & 1) == 0 & ((byte)(uVar6 >> 0x1d) | this->health < iVar5);
    iVar4 = (this->DamageType).super_FName.Index;
    if (iVar4 == 0) {
LAB_0040770a:
      (this->DamageType).super_FName.Index = 0;
LAB_00407711:
      if (bVar21 != 0) {
        local_150.Index = 0x8c;
        local_154.Index = 0xce;
        pFVar9 = FindState(this,&local_150,&local_154,true);
        if (pFVar9 != (FState *)0x0) {
LAB_004077c6:
          if (bVar21 != 0) goto LAB_004077cf;
          goto LAB_00407980;
        }
      }
      local_158.Index = 0x8c;
      pFVar9 = FindState(this,&local_158);
      if (pFVar9 == (FState *)0x0) goto LAB_0040775c;
    }
    else {
      if (iVar4 == 0xce) {
        (this->DamageType).super_FName.Index = 0;
        bVar21 = 1;
        goto LAB_0040770a;
      }
      if (bVar21 == 0) {
LAB_0040779d:
        local_144.Index = 0x8c;
        local_148.Index = iVar4;
        pFVar9 = FindState(this,&local_144,&local_148,true);
        if (pFVar9 != (FState *)0x0) {
          bVar21 = 0;
          goto LAB_004077c6;
        }
        iVar4 = (this->DamageType).super_FName.Index;
        if (iVar4 != 0x33) {
LAB_00407a33:
          if (iVar4 != 0xca) goto LAB_0040770a;
          goto LAB_00407711;
        }
        if (((deh.NoAutofreeze != 0) || (((this->flags4).Value & 4) != 0)) ||
           ((this->player == (player_t *)0x0 && (((this->flags3).Value & 0x2000) == 0))))
        goto LAB_0040770a;
        local_14c.Index = 0x95;
        pFVar9 = FindState(this,&local_14c);
        if (pFVar9 == (FState *)0x0) {
          iVar4 = (this->DamageType).super_FName.Index;
          bVar21 = 0;
          goto LAB_00407a33;
        }
      }
      else {
        buff[0] = -0x74;
        buff[1] = '\0';
        buff[2] = '\0';
        buff[3] = '\0';
        buff[4] = -0x32;
        buff[5] = '\0';
        buff[6] = '\0';
        buff[7] = '\0';
        buff._8_4_ = iVar4;
        pFVar9 = FindState(this,3,(FName *)buff,true);
        if (pFVar9 == (FState *)0x0) {
          iVar4 = (this->DamageType).super_FName.Index;
          goto LAB_0040779d;
        }
LAB_004077cf:
        if (this->player == (player_t *)0x0) {
          if (iVar5 <= this->health) {
            this->health = iVar5 + -1;
          }
        }
        else {
          pbVar1 = (byte *)((long)&this->player->cheats + 2);
          *pbVar1 = *pbVar1 | 0x40;
        }
      }
    }
LAB_00407980:
    SetState(this,pFVar9,false);
    if (1 < this->tics) {
      uVar6 = FRandom::operator()(&pr_killmobj);
      iVar5 = this->tics - (uVar6 & 3);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      this->tics = iVar5;
    }
  }
  else {
LAB_0040775c:
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  }
  return;
}

Assistant:

void AActor::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	// Handle possible unmorph on death
	bool wasgibbed = (health < GetGibHealth());
	AActor *realthis = NULL;
	int realstyle = 0;
	int realhealth = 0;
	if (P_MorphedDeath(this, &realthis, &realstyle, &realhealth))
	{
		if (!(realstyle & MORPH_UNDOBYDEATHSAVES))
		{
			if (wasgibbed)
			{
				int realgibhealth = realthis->GetGibHealth();
				if (realthis->health >= realgibhealth)
				{
					realthis->health = realgibhealth -1; // if morphed was gibbed, so must original be (where allowed)l
				}
			}
			realthis->CallDie(source, inflictor, dmgflags);
		}
		return;
	}

	// [SO] 9/2/02 -- It's rather funny to see an exploded player body with the invuln sparkle active :) 
	effects &= ~FX_RESPAWNINVUL;
	//flags &= ~MF_INVINCIBLE;

	if (debugfile && this->player)
	{
		static int dieticks[MAXPLAYERS]; // [ZzZombo] not used? Except if for peeking in debugger...
		int pnum = int(this->player-players);
		dieticks[pnum] = gametic;
		fprintf (debugfile, "died (%d) on tic %d (%s)\n", pnum, gametic,
		this->player->cheats&CF_PREDICTING?"predicting":"real");
	}

	// [RH] Notify this actor's items.
	for (AInventory *item = Inventory; item != NULL; )
	{
		AInventory *next = item->Inventory;
		item->OwnerDied();
		item = next;
	}

	if (flags & MF_MISSILE)
	{ // [RH] When missiles die, they just explode
		P_ExplodeMissile (this, NULL, NULL);
		return;
	}
	// [RH] Set the target to the thing that killed it. Strife apparently does this.
	if (source != NULL)
	{
		target = source;
	}

	// [JM] Fire KILL type scripts for actor. Not needed for players, since they have the "DEATH" script type.
	if (!player && !(flags7 & MF7_NOKILLSCRIPTS) && ((flags7 & MF7_USEKILLSCRIPTS) || gameinfo.forcekillscripts))
	{
		FBehavior::StaticStartTypedScripts(SCRIPT_Kill, this, true, 0, true);
	}

	flags &= ~(MF_SHOOTABLE|MF_FLOAT|MF_SKULLFLY);
	if (!(flags4 & MF4_DONTFALL)) flags&=~MF_NOGRAVITY;
	flags |= MF_DROPOFF;
	if ((flags3 & MF3_ISMONSTER) || FindState(NAME_Raise) != NULL || IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{	// [RH] Only monsters get to be corpses.
		// Objects with a raise state should get the flag as well so they can
		// be revived by an Arch-Vile. Batman Doom needs this.
		// [RC] And disable this if DONTCORPSE is set, of course.
		if(!(flags6 & MF6_DONTCORPSE)) flags |= MF_CORPSE;
	}
	flags6 |= MF6_KILLED;

	// [RH] Allow the death height to be overridden using metadata.
	double metaheight = -1;
	if (DamageType == NAME_Fire)
	{
		metaheight = GetClass()->BurnHeight;
	}
	if (metaheight < 0)
	{
		metaheight = GetClass()->DeathHeight;
	}
	if (metaheight < 0)
	{
		Height *= 0.25;
	}
	else
	{
		Height = MAX<double> (metaheight, 0);
	}

	// [RH] If the thing has a special, execute and remove it
	//		Note that the thing that killed it is considered
	//		the activator of the script.
	// New: In Hexen, the thing that died is the activator,
	//		so now a level flag selects who the activator gets to be.
	// Everything is now moved to P_ActivateThingSpecial().
	if (special && (!(flags & MF_SPECIAL) || (flags3 & MF3_ISMONSTER))
		&& !(activationtype & THINGSPEC_NoDeathSpecial))
	{
		P_ActivateThingSpecial(this, source, true); 
	}

	if (CountsAsKill())
		level.killed_monsters++;
		
	if (source && source->player)
	{
		if (CountsAsKill())
		{ // count for intermission
			source->player->killcount++;
		}

		// Don't count any frags at level start, because they're just telefrags
		// resulting from insufficient deathmatch starts, and it wouldn't be
		// fair to count them toward a player's score.
		if (player && level.maptime)
		{
			source->player->frags[player - players]++;
			if (player == source->player)	// [RH] Cumulative frag count
			{
				char buff[256];

				player->fragcount--;
				if (deathmatch && player->spreecount >= 5 && cl_showsprees)
				{
					SexMessage (GStrings("SPREEKILLSELF"), buff,
						player->userinfo.GetGender(), player->userinfo.GetName(),
						player->userinfo.GetName());
					StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
							1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
				}
			}
			else
			{
				if ((dmflags2 & DF2_YES_LOSEFRAG) && deathmatch)
					player->fragcount--;

				if (this->IsTeammate(source))
				{
					source->player->fragcount--;
				}
				else
				{
					++source->player->fragcount;
					++source->player->spreecount;
				}

				if (source->player->morphTics)
				{ // Make a super chicken
					source->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
				}

				if (deathmatch && cl_showsprees)
				{
					const char *spreemsg;
					char buff[256];

					switch (source->player->spreecount)
					{
					case 5:
						spreemsg = GStrings("SPREE5");
						break;
					case 10:
						spreemsg = GStrings("SPREE10");
						break;
					case 15:
						spreemsg = GStrings("SPREE15");
						break;
					case 20:
						spreemsg = GStrings("SPREE20");
						break;
					case 25:
						spreemsg = GStrings("SPREE25");
						break;
					default:
						spreemsg = NULL;
						break;
					}

					if (spreemsg == NULL && player->spreecount >= 5)
					{
						if (!AnnounceSpreeLoss (this))
						{
							SexMessage (GStrings("SPREEOVER"), buff, player->userinfo.GetGender(),
								player->userinfo.GetName(), source->player->userinfo.GetName());
							StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
								1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
						}
					}
					else if (spreemsg != NULL)
					{
						if (!AnnounceSpree (source))
						{
							SexMessage (spreemsg, buff, player->userinfo.GetGender(),
								player->userinfo.GetName(), source->player->userinfo.GetName());
							StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
								1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
						}
					}
				}
			}

			// [RH] Multikills
			if (player != source->player)
			{
				source->player->multicount++;
				if (source->player->lastkilltime > 0)
				{
					if (source->player->lastkilltime < level.time - 3*TICRATE)
					{
						source->player->multicount = 1;
					}

					if (deathmatch &&
						source->CheckLocalView (consoleplayer) &&
						cl_showmultikills)
					{
						const char *multimsg;

						switch (source->player->multicount)
						{
						case 1:
							multimsg = NULL;
							break;
						case 2:
							multimsg = GStrings("MULTI2");
							break;
						case 3:
							multimsg = GStrings("MULTI3");
							break;
						case 4:
							multimsg = GStrings("MULTI4");
							break;
						default:
							multimsg = GStrings("MULTI5");
							break;
						}
						if (multimsg != NULL)
						{
							char buff[256];

							if (!AnnounceMultikill (source))
							{
								SexMessage (multimsg, buff, player->userinfo.GetGender(),
									player->userinfo.GetName(), source->player->userinfo.GetName());
								StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
									1.5f, 0.8f, 0, 0, CR_RED, 3.f, 0.5f), MAKE_ID('M','K','I','L'));
							}
						}
					}
				}
				source->player->lastkilltime = level.time;
			}

			// [RH] Implement fraglimit
			if (deathmatch && fraglimit &&
				fraglimit <= D_GetFragCount (source->player))
			{
				Printf ("%s\n", GStrings("TXT_FRAGLIMIT"));
				G_ExitLevel (0, false);
			}
		}
	}
	else if (!multiplayer && CountsAsKill())
	{
		// count all monster deaths,
		// even those caused by other monsters
		players[0].killcount++;
	}

	if (player)
	{
		// [RH] Death messages
		ClientObituary (this, inflictor, source, dmgflags);

		// Death script execution, care of Skull Tag
		FBehavior::StaticStartTypedScripts (SCRIPT_Death, this, true);

		// [RH] Force a delay between death and respawn
		player->respawn_time = level.time + TICRATE;

		//Added by MC: Respawn bots
		if (bglobal.botnum && !demoplayback)
		{
			if (player->Bot != NULL)
				player->Bot->t_respawn = (pr_botrespawn()%15)+((bglobal.botnum-1)*2)+TICRATE+1;

			//Added by MC: Discard enemies.
			for (int i = 0; i < MAXPLAYERS; i++)
			{
				if (players[i].Bot != NULL && this == players[i].Bot->enemy)
				{
					if (players[i].Bot->dest ==  players[i].Bot->enemy)
						players[i].Bot->dest = NULL;
					players[i].Bot->enemy = NULL;
				}
			}

			player->spreecount = 0;
			player->multicount = 0;
		}

		// count environment kills against you
		if (!source)
		{
			player->frags[player - players]++;
			player->fragcount--;	// [RH] Cumulative frag count
		}
						
		flags &= ~MF_SOLID;
		player->playerstate = PST_DEAD;
		P_DropWeapon (player);
		if (this == players[consoleplayer].camera && automapactive)
		{
			// don't die in auto map, switch view prior to dying
			AM_Stop ();
		}

		// [GRB] Clear extralight. When you killed yourself with weapon that
		// called A_Light1/2 before it called A_Light0, extraligh remained.
		player->extralight = 0;
	}

	// [RH] If this is the unmorphed version of another monster, destroy this
	// actor, because the morphed version is the one that will stick around in
	// the level.
	if (flags & MF_UNMORPHED)
	{
		Destroy ();
		return;
	}



	FState *diestate = NULL;
	int gibhealth = GetGibHealth();
	ActorFlags4 iflags4 = inflictor == NULL ? ActorFlags4::FromInt(0) : inflictor->flags4;
	bool extremelydead = ((health < gibhealth || iflags4 & MF4_EXTREMEDEATH) && !(iflags4 & MF4_NOEXTREMEDEATH));

	// Special check for 'extreme' damage type to ensure that it gets recorded properly as an extreme death for subsequent checks.
	if (DamageType == NAME_Extreme)
	{
		extremelydead = true;
		DamageType = NAME_None;
	}

	// find the appropriate death state. The order is:
	//
	// 1. If damagetype is not 'none' and death is extreme, try a damage type specific extreme death state
	// 2. If no such state is found or death is not extreme try a damage type specific normal death state
	// 3. If damagetype is 'ice' and actor is a monster or player, try the generic freeze death (unless prohibited)
	// 4. If no state has been found and death is extreme, try the extreme death state
	// 5. If no such state is found or death is not extreme try the regular death state.
	// 6. If still no state has been found, destroy the actor immediately.

	if (DamageType != NAME_None)
	{
		if (extremelydead)
		{
			FName labels[] = { NAME_Death, NAME_Extreme, DamageType };
			diestate = FindState(3, labels, true);
		}
		if (diestate == NULL)
		{
			diestate = FindState (NAME_Death, DamageType, true);
			if (diestate != NULL) extremelydead = false;
		}
		if (diestate == NULL)
		{
			if (DamageType == NAME_Ice)
			{ // If an actor doesn't have an ice death, we can still give them a generic one.

				if (!deh.NoAutofreeze && !(flags4 & MF4_NOICEDEATH) && (player || (flags3 & MF3_ISMONSTER)))
				{
					diestate = FindState(NAME_GenericFreezeDeath);
					extremelydead = false;
				}
			}
		}
	}
	if (diestate == NULL)
	{
		
		// Don't pass on a damage type this actor cannot handle.
		// (most importantly, prevent barrels from passing on ice damage.)
		// Massacre must be preserved though.
		if (DamageType != NAME_Massacre)
		{
			DamageType = NAME_None;	
		}

		if (extremelydead)
		{ // Extreme death
			diestate = FindState (NAME_Death, NAME_Extreme, true);
		}
		if (diestate == NULL)
		{ // Normal death
			extremelydead = false;
			diestate = FindState (NAME_Death);
		}
	}

	if (extremelydead)
	{ 
		// We'll only get here if an actual extreme death state was used.

		// For players, mark the appropriate flag.
		if (player != NULL)
		{
			player->cheats |= CF_EXTREMELYDEAD;
		}
		// If a non-player, mark as extremely dead for the crash state.
		else if (health >= gibhealth)
		{
			health = gibhealth - 1;
		}
	}

	if (diestate != NULL)
	{
		SetState (diestate);

		if (tics > 1)
		{
			tics -= pr_killmobj() & 3;
			if (tics < 1)
				tics = 1;
		}
	}
	else
	{
		Destroy();
	}
}